

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderInvarianceTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::anon_unknown_1::InvarianceTest::checkImage
          (InvarianceTest *this,Surface *surface)

{
  int iVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  bool bVar4;
  allocator<char> local_751;
  string local_750;
  allocator<char> local_729;
  string local_728;
  LogImage local_708;
  allocator<char> local_671;
  string local_670;
  allocator<char> local_649;
  string local_648;
  LogImageSet local_628;
  MessageBuilder local_5e8;
  undefined4 local_468;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  LogImage local_418;
  allocator<char> local_381;
  string local_380;
  allocator<char> local_359;
  string local_358;
  LogImage local_338;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  LogImageSet local_258;
  MessageBuilder local_218;
  deUint32 local_94;
  RGBA local_90;
  int local_8c;
  RGBA col;
  int x;
  int y;
  PixelBufferAccess local_78;
  undefined1 local_50 [8];
  Surface errorMask;
  undefined1 local_30 [3];
  bool error;
  RGBA errColor;
  IVec4 okColor;
  Surface *surface_local;
  InvarianceTest *this_local;
  
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_30,0,0xff,0,0xff);
  tcu::RGBA::RGBA((RGBA *)((long)&errorMask.m_pixels.m_cap + 4),0xff,0,0,0xff);
  errorMask.m_pixels.m_cap._3_1_ = 0;
  tcu::Surface::Surface((Surface *)local_50,this->m_renderSize,this->m_renderSize);
  tcu::Surface::getAccess(&local_78,(Surface *)local_50);
  tcu::clear(&local_78,(IVec4 *)local_30);
  for (col.m_value = 0; (int)col.m_value < this->m_renderSize; col.m_value = col.m_value + 1) {
    for (local_8c = 0; local_8c < this->m_renderSize; local_8c = local_8c + 1) {
      local_90 = tcu::Surface::getPixel(surface,local_8c,col.m_value);
      iVar1 = tcu::RGBA::getRed(&local_90);
      if (iVar1 != 0) {
        local_94 = errorMask.m_pixels.m_cap._4_4_;
        tcu::Surface::setPixel
                  ((Surface *)local_50,local_8c,col.m_value,errorMask.m_pixels.m_cap._4_4_);
        errorMask.m_pixels.m_cap._3_1_ = 1;
      }
    }
  }
  bVar4 = (errorMask.m_pixels.m_cap._3_1_ & 1) == 0;
  if (bVar4) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_5e8,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_5e8,(char (*) [19])"No variance found.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_5e8);
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"Results",&local_649);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_670,"Result verification",&local_671);
    tcu::LogImageSet::LogImageSet(&local_628,&local_648,&local_670);
    pTVar2 = tcu::TestLog::operator<<(pTVar2,&local_628);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"Result",&local_729);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"Result",&local_751);
    tcu::LogImage::LogImage(&local_708,&local_728,&local_750,surface,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    pTVar2 = tcu::TestLog::operator<<(pTVar2,&local_708);
    tcu::TestLog::operator<<(pTVar2,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_708);
    std::__cxx11::string::~string((string *)&local_750);
    std::allocator<char>::~allocator(&local_751);
    std::__cxx11::string::~string((string *)&local_728);
    std::allocator<char>::~allocator(&local_729);
    tcu::LogImageSet::~LogImageSet(&local_628);
    std::__cxx11::string::~string((string *)&local_670);
    std::allocator<char>::~allocator(&local_671);
    std::__cxx11::string::~string((string *)&local_648);
    std::allocator<char>::~allocator(&local_649);
  }
  else {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_218,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_218,
                        (char (*) [82])
                        "Invalid pixels found (fragments from first render pass found). Variance detected."
                       );
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_218);
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"Results",&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"Result verification",&local_2a1);
    tcu::LogImageSet::LogImageSet(&local_258,&local_278,&local_2a0);
    pTVar2 = tcu::TestLog::operator<<(pTVar2,&local_258);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"Result",&local_359);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"Result",&local_381);
    tcu::LogImage::LogImage(&local_338,&local_358,&local_380,surface,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    pTVar2 = tcu::TestLog::operator<<(pTVar2,&local_338);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"Error mask",&local_439)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"Error mask",&local_461)
    ;
    tcu::LogImage::LogImage
              (&local_418,&local_438,&local_460,(Surface *)local_50,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar2 = tcu::TestLog::operator<<(pTVar2,&local_418);
    tcu::TestLog::operator<<(pTVar2,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_418);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator(&local_461);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator(&local_439);
    tcu::LogImage::~LogImage(&local_338);
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator(&local_381);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator(&local_359);
    tcu::LogImageSet::~LogImageSet(&local_258);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
  }
  local_468 = 1;
  tcu::Surface::~Surface((Surface *)local_50);
  return bVar4;
}

Assistant:

bool InvarianceTest::checkImage (const tcu::Surface& surface) const
{
	const tcu::IVec4	okColor		= tcu::IVec4(0, 255, 0, 255);
	const tcu::RGBA		errColor	= tcu::RGBA(255, 0, 0, 255);
	bool				error		= false;
	tcu::Surface		errorMask	(m_renderSize, m_renderSize);

	tcu::clear(errorMask.getAccess(), okColor);

	for (int y = 0; y < m_renderSize; ++y)
	for (int x = 0; x < m_renderSize; ++x)
	{
		const tcu::RGBA col = surface.getPixel(x, y);

		if (col.getRed() != 0)
		{
			errorMask.setPixel(x, y, errColor);
			error = true;
		}
	}

	// report error
	if (error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid pixels found (fragments from first render pass found). Variance detected." << tcu::TestLog::EndMessage;
		m_testCtx.getLog()
			<< tcu::TestLog::ImageSet("Results", "Result verification")
			<< tcu::TestLog::Image("Result",		"Result",		surface)
			<< tcu::TestLog::Image("Error mask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;

		return false;
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "No variance found." << tcu::TestLog::EndMessage;
		m_testCtx.getLog()
			<< tcu::TestLog::ImageSet("Results", "Result verification")
			<< tcu::TestLog::Image("Result", "Result", surface)
			<< tcu::TestLog::EndImageSet;

		return true;
	}
}